

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::ConfidentialTransactionController::SetWitnessStack
          (ConfidentialTransactionController *this,Txid *txid,uint32_t vout,uint32_t witness_index,
          string *hex_string)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  core::ByteData::ByteData((ByteData *)&local_40,hex_string);
  SetWitnessStack(this,txid,vout,witness_index,(ByteData *)&local_40);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void ConfidentialTransactionController::SetWitnessStack(
    const Txid& txid, uint32_t vout, uint32_t witness_index,
    const std::string& hex_string) {
  SetWitnessStack(txid, vout, witness_index, ByteData(hex_string));
}